

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_build_certificate_message
              (ptls_buffer_t *buf,ptls_iovec_t context,ptls_iovec_t *certificates,
              size_t num_certificates,ptls_iovec_t ocsp_status)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  size_t sVar6;
  undefined1 local_6b;
  undefined2 local_6a;
  size_t local_68;
  size_t local_60;
  ptls_iovec_t *local_58;
  uint8_t *local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  iVar1 = ptls_buffer__do_pushv(buf,"",1);
  if (iVar1 == 0) {
    sVar6 = buf->off;
    iVar1 = ptls_buffer__do_pushv(buf,context.base,context.len);
    if (iVar1 == 0) {
      buf->base[sVar6 - 1] = (char)(int)buf->off - (char)sVar6;
      iVar1 = ptls_buffer__do_pushv(buf,"",3);
      if (iVar1 == 0) {
        local_60 = buf->off;
        local_50 = ocsp_status.base;
        local_68 = ocsp_status.len;
        local_58 = certificates;
        local_38 = num_certificates;
        for (sVar6 = 0; sVar6 != local_38; sVar6 = sVar6 + 1) {
          iVar1 = ptls_buffer__do_pushv(buf,"",3);
          if (iVar1 != 0) {
            return iVar1;
          }
          sVar5 = buf->off;
          iVar1 = ptls_buffer__do_pushv(buf,certificates[sVar6].base,certificates[sVar6].len);
          if (iVar1 != 0) {
            return iVar1;
          }
          uVar2 = buf->off - sVar5;
          for (lVar4 = 0x10; lVar4 != -8; lVar4 = lVar4 + -8) {
            buf->base[sVar5 - 3] = (uint8_t)(uVar2 >> ((byte)lVar4 & 0x3f));
            sVar5 = sVar5 + 1;
          }
          iVar1 = ptls_buffer__do_pushv(buf,"",2);
          if (iVar1 != 0) {
            return iVar1;
          }
          sVar5 = buf->off;
          sVar3 = sVar5;
          if (sVar6 == 0 && local_68 != 0) {
            local_6a = 0x500;
            local_40 = sVar6;
            iVar1 = ptls_buffer__do_pushv(buf,&local_6a,2);
            if (iVar1 != 0) {
              return iVar1;
            }
            iVar1 = ptls_buffer__do_pushv(buf,"",2);
            if (iVar1 != 0) {
              return iVar1;
            }
            local_48 = buf->off;
            local_6b = 1;
            iVar1 = ptls_buffer__do_pushv(buf,&local_6b,1);
            if (iVar1 != 0) {
              return iVar1;
            }
            iVar1 = ptls_buffer__do_pushv(buf,"",3);
            if (iVar1 != 0) {
              return iVar1;
            }
            sVar6 = buf->off;
            iVar1 = ptls_buffer__do_pushv(buf,local_50,local_68);
            if (iVar1 != 0) {
              return iVar1;
            }
            uVar2 = buf->off - sVar6;
            for (lVar4 = 0x10; lVar4 != -8; lVar4 = lVar4 + -8) {
              buf->base[sVar6 - 3] = (uint8_t)(uVar2 >> ((byte)lVar4 & 0x3f));
              sVar6 = sVar6 + 1;
            }
            lVar4 = buf->off - local_48;
            buf->base[local_48 - 2] = (uint8_t)((ulong)lVar4 >> 8);
            buf->base[local_48 - 1] = (uint8_t)lVar4;
            sVar3 = buf->off;
            sVar6 = local_40;
            certificates = local_58;
          }
          buf->base[sVar5 - 2] = (uint8_t)(sVar3 - sVar5 >> 8);
          buf->base[sVar5 - 1] = (uint8_t)(sVar3 - sVar5);
        }
        uVar2 = buf->off - local_60;
        for (lVar4 = 0x10; lVar4 != -8; lVar4 = lVar4 + -8) {
          buf->base[local_60 - 3] = (uint8_t)(uVar2 >> ((byte)lVar4 & 0x3f));
          local_60 = local_60 + 1;
        }
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int ptls_build_certificate_message(ptls_buffer_t *buf, ptls_iovec_t context, ptls_iovec_t *certificates, size_t num_certificates,
                                   ptls_iovec_t ocsp_status)
{
    int ret;

    ptls_buffer_push_block(buf, 1, { ptls_buffer_pushv(buf, context.base, context.len); });
    ptls_buffer_push_block(buf, 3, {
        size_t i;
        for (i = 0; i != num_certificates; ++i) {
            ptls_buffer_push_block(buf, 3, { ptls_buffer_pushv(buf, certificates[i].base, certificates[i].len); });
            ptls_buffer_push_block(buf, 2, {
                if (i == 0 && ocsp_status.len != 0) {
                    buffer_push_extension(buf, PTLS_EXTENSION_TYPE_STATUS_REQUEST, {
                        ptls_buffer_push(buf, 1); /* status_type == ocsp */
                        ptls_buffer_push_block(buf, 3, { ptls_buffer_pushv(buf, ocsp_status.base, ocsp_status.len); });
                    });
                }
            });
        }
    });

    ret = 0;
Exit:
    return ret;
}